

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void tok_del_define(tokcxdef *ctx,char *sym,int len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  tokdfdef *__ptr;
  long lVar4;
  tokdfdef *ptVar5;
  tokdfdef *ptVar6;
  
  uVar3 = 0;
  if (len != 0) {
    lVar4 = 0;
    do {
      uVar1 = (int)uVar3 + (uint)(byte)sym[lVar4] & 0x3f;
      uVar3 = (ulong)uVar1;
      lVar4 = lVar4 + 1;
    } while (len != (int)lVar4);
    uVar3 = (ulong)uVar1;
  }
  if (ctx->tokcxdf[uVar3] != (tokdfdef *)0x0) {
    ptVar6 = ctx->tokcxdf[uVar3];
    ptVar5 = (tokdfdef *)0x0;
    do {
      __ptr = ptVar6;
      if (__ptr->len == len) {
        iVar2 = bcmp(__ptr->nm,sym,(long)len);
        if (iVar2 == 0) {
          ptVar6 = (tokdfdef *)(ctx->tokcxdf + uVar3);
          if (ptVar5 != (tokdfdef *)0x0) {
            ptVar6 = ptVar5;
          }
          ptVar6->nxt = __ptr->nxt;
          free(__ptr);
          return;
        }
      }
      ptVar6 = __ptr->nxt;
      ptVar5 = __ptr;
    } while (__ptr->nxt != (tokdfdef *)0x0);
  }
  return;
}

Assistant:

void tok_del_define(tokcxdef *ctx, char *sym, int len)
{
    int       hsh;
    tokdfdef *df;
    tokdfdef *prv;
    
    /* find the appropriate chain the hash table */
    hsh = tokdfhsh(sym, len);

    /* search the chain for this symbol */
    for (prv = 0, df = ctx->tokcxdf[hsh] ; df ; prv = df, df = df->nxt)
    {
        /* if this one matches, delete it */
        if (df->len == len && !memcmp(df->nm, sym, (size_t)len))
        {
            /* unlink it from the chain */
            if (prv)
                prv->nxt = df->nxt;
            else
                ctx->tokcxdf[hsh] = df->nxt;

            /* delete this symbol, and we're done */
            mchfre(df);
            break;
        }
    }
}